

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O2

void dmrC_allocator_destroy(allocator *A)

{
  dmrC_allocator_drop_all_allocations(A);
  A->blobs_ = (allocation_blob *)0x0;
  A->freelist_ = (void *)0x0;
  A->allocations = 0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  return;
}

Assistant:

void dmrC_allocator_destroy(struct allocator *A) {
  dmrC_allocator_drop_all_allocations(A);
  A->blobs_ = NULL;
  A->allocations = 0;
  A->total_bytes = 0;
  A->useful_bytes = 0;
  A->freelist_ = NULL;
}